

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floor1.c
# Opt level: O3

int floor1_encode(oggpack_buffer *opb,vorbis_block *vb,vorbis_look_floor1 *look,int *post,
                 int *ilogmask)

{
  vorbis_info_floor1 *pvVar1;
  void *pvVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  int bookas [8];
  int maxval [8];
  int out [65];
  uint local_178 [17];
  int local_134;
  uint local_130 [64];
  
  if (post == (int *)0x0) {
    iVar13 = 0;
    oggpack_write(opb,0,1);
    memset(ilogmask,0,(long)(vb->pcmend / 2) << 2);
  }
  else {
    pvVar1 = look->vi;
    iVar13 = look->posts;
    pvVar2 = vb->vd->vi->codec_setup;
    lVar7 = *(long *)((long)pvVar2 + 0x1328);
    if (iVar13 < 1) {
      local_178[0x10] = *post;
      local_134 = post[1];
    }
    else {
      lVar6 = 0;
      do {
        uVar14 = post[lVar6] & 0x7fff;
        switch(pvVar1->mult) {
        case 1:
          uVar14 = uVar14 >> 2;
          break;
        case 2:
          uVar14 = uVar14 >> 3;
          break;
        case 3:
          uVar14 = uVar14 / 0xc;
          break;
        case 4:
          uVar14 = uVar14 >> 4;
        }
        post[lVar6] = post[lVar6] & 0x8000U | uVar14;
        lVar6 = lVar6 + 1;
      } while (iVar13 != lVar6);
      local_178[0x10] = *post;
      local_134 = post[1];
      if (2 < iVar13) {
        lVar6 = 0;
        do {
          iVar5 = look->loneighbor[lVar6];
          iVar8 = look->hineighbor[lVar6];
          uVar14 = post[iVar5] & 0x7fff;
          iVar20 = (post[iVar8] & 0x7fffU) - uVar14;
          iVar9 = -iVar20;
          if (0 < iVar20) {
            iVar9 = iVar20;
          }
          iVar3 = ((pvVar1->postlist[lVar6 + 2] - pvVar1->postlist[iVar5]) * iVar9) /
                  (pvVar1->postlist[iVar8] - pvVar1->postlist[iVar5]);
          iVar9 = -iVar3;
          if (-1 < iVar20) {
            iVar9 = iVar3;
          }
          uVar17 = iVar9 + uVar14;
          uVar4 = post[lVar6 + 2];
          if (((short)uVar4 < 0) || (uVar4 == uVar17)) {
            post[lVar6 + 2] = uVar17 | 0x8000;
            local_178[lVar6 + 0x12] = 0;
          }
          else {
            uVar11 = look->quant_q - uVar17;
            if ((int)uVar17 <= (int)uVar11) {
              uVar11 = uVar17;
            }
            uVar4 = uVar4 - uVar17;
            if ((int)uVar4 < 0) {
              if (SBORROW4(uVar4,-uVar11) != (int)(uVar4 + uVar11) < 0) {
                uVar4 = ~uVar4;
                goto LAB_001dfcbd;
              }
              uVar11 = ~(uVar4 * 2);
            }
            else if ((int)uVar4 < (int)uVar11) {
              uVar11 = uVar4 * 2;
            }
            else {
LAB_001dfcbd:
              uVar11 = uVar11 + uVar4;
            }
            local_178[lVar6 + 0x12] = uVar11;
            post[iVar5] = uVar14;
            post[iVar8] = post[iVar8] & 0x7fff;
          }
          lVar6 = lVar6 + 1;
        } while ((long)iVar13 + -2 != lVar6);
      }
    }
    iVar13 = local_134;
    uVar14 = local_178[0x10];
    oggpack_write(opb,1,1);
    look->frames = look->frames + 1;
    iVar5 = ov_ilog(look->quant_q - 1);
    look->postbits = look->postbits + (long)(iVar5 * 2);
    iVar5 = ov_ilog(look->quant_q - 1);
    oggpack_write(opb,(long)(int)uVar14,iVar5);
    iVar5 = ov_ilog(look->quant_q - 1);
    oggpack_write(opb,(long)iVar13,iVar5);
    if (0 < pvVar1->partitions) {
      lVar21 = 2;
      lVar6 = 0;
      do {
        iVar13 = pvVar1->partitionclass[lVar6];
        iVar5 = pvVar1->class_subs[iVar13];
        uVar4 = 1 << ((byte)iVar5 & 0x1f);
        uVar14 = pvVar1->class_dim[iVar13];
        local_178[4] = 0;
        local_178[5] = 0;
        local_178[6] = 0;
        local_178[7] = 0;
        local_178[0] = 0;
        local_178[1] = 0;
        local_178[2] = 0;
        local_178[3] = 0;
        if (iVar5 != 0) {
          local_178[0xc] = 0;
          local_178[0xd] = 0;
          local_178[0xe] = 0;
          local_178[0xf] = 0;
          local_178[8] = 0;
          local_178[9] = 0;
          local_178[10] = 0;
          local_178[0xb] = 0;
          if (iVar5 != 0x1f) {
            uVar10 = 1;
            if (1 < (int)uVar4) {
              uVar10 = (ulong)uVar4;
            }
            uVar15 = 0;
            do {
              lVar16 = (long)pvVar1->class_subbook[iVar13][uVar15];
              if (lVar16 < 0) {
                uVar17 = 1;
              }
              else {
                uVar17 = *(uint *)(*(long *)((long)pvVar2 + lVar16 * 8 + 0xb28) + 8);
              }
              local_178[uVar15 + 8] = uVar17;
              uVar15 = uVar15 + 1;
            } while (uVar10 != uVar15);
          }
          if ((int)uVar14 < 1) {
            uVar17 = 0;
          }
          else {
            if ((int)uVar4 < 2) {
              uVar4 = 1;
            }
            uVar10 = 0;
            iVar8 = 0;
            uVar17 = 0;
            do {
              if (iVar5 != 0x1f) {
                uVar15 = 0;
                do {
                  if ((int)local_178[lVar21 + uVar10 + 0x10] < (int)local_178[uVar15 + 8]) {
                    local_178[uVar10] = (uint)uVar15;
                    break;
                  }
                  uVar15 = uVar15 + 1;
                } while (uVar4 != uVar15);
              }
              uVar17 = uVar17 | local_178[uVar10] << ((byte)iVar8 & 0x1f);
              iVar8 = iVar8 + iVar5;
              uVar10 = uVar10 + 1;
            } while (uVar10 != uVar14);
          }
          iVar5 = vorbis_book_encode((codebook *)((long)pvVar1->class_book[iVar13] * 0x60 + lVar7),
                                     uVar17,opb);
          look->phrasebits = look->phrasebits + (long)iVar5;
        }
        if (0 < (int)uVar14) {
          uVar10 = 0;
          do {
            lVar16 = (long)pvVar1->class_subbook[iVar13][(int)local_178[uVar10]];
            if (-1 < lVar16) {
              lVar16 = lVar16 * 0x60;
              if ((long)(int)local_178[lVar21 + uVar10 + 0x10] < *(long *)(lVar7 + 8 + lVar16)) {
                iVar5 = vorbis_book_encode((codebook *)(lVar16 + lVar7),
                                           local_178[lVar21 + uVar10 + 0x10],opb);
                look->postbits = look->postbits + (long)iVar5;
              }
            }
            uVar10 = uVar10 + 1;
          } while (uVar14 != uVar10);
        }
        lVar21 = lVar21 + (int)uVar14;
        lVar6 = lVar6 + 1;
      } while (lVar6 < pvVar1->partitions);
    }
    iVar5 = pvVar1->mult * *post;
    uVar14 = 0;
    if (1 < look->posts) {
      lVar7 = *(long *)((long)pvVar2 + vb->W * 8);
      lVar6 = 1;
      uVar4 = 0;
      uVar14 = 0;
      do {
        iVar13 = iVar5;
        uVar17 = uVar4;
        if ((uint)post[look->forward_index[lVar6]] < 0x8000) {
          iVar13 = post[look->forward_index[lVar6]] * pvVar1->mult;
          uVar14 = pvVar1->postlist[look->forward_index[lVar6]];
          iVar9 = iVar13 - iVar5;
          iVar20 = uVar14 - uVar4;
          iVar8 = -iVar9;
          if (0 < iVar9) {
            iVar8 = iVar9;
          }
          iVar12 = (iVar9 / iVar20) * iVar20;
          iVar3 = -iVar12;
          if (iVar12 < 1) {
            iVar3 = iVar12;
          }
          uVar17 = (uint)((ulong)(lVar7 - (lVar7 >> 0x3f)) >> 1);
          uVar11 = uVar14;
          if ((int)uVar17 < (int)uVar14) {
            uVar11 = uVar17;
          }
          if ((int)uVar4 < (int)uVar11) {
            ilogmask[(int)uVar4] = iVar5;
          }
          uVar17 = uVar14;
          if ((int)(uVar4 + 1) < (int)uVar11) {
            lVar21 = 0;
            iVar12 = 0;
            do {
              iVar12 = iVar12 + iVar8 + iVar3;
              uVar18 = 0;
              iVar19 = 0;
              if (iVar20 <= iVar12) {
                uVar18 = iVar9 >> 0x1f | 1;
                iVar19 = iVar20;
              }
              iVar12 = iVar12 - iVar19;
              iVar5 = iVar5 + iVar9 / iVar20 + uVar18;
              ilogmask[(int)(uVar4 + 1) + lVar21] = iVar5;
              lVar21 = lVar21 + 1;
            } while (~uVar4 + uVar11 != (int)lVar21);
          }
        }
        uVar4 = uVar17;
        iVar5 = iVar13;
        lVar6 = lVar6 + 1;
      } while (lVar6 < look->posts);
    }
    iVar13 = 1;
    if ((int)uVar14 < vb->pcmend / 2) {
      lVar7 = (long)(int)uVar14;
      do {
        ilogmask[lVar7] = iVar5;
        lVar7 = lVar7 + 1;
      } while (lVar7 < vb->pcmend / 2);
    }
  }
  return iVar13;
}

Assistant:

int floor1_encode(oggpack_buffer *opb,vorbis_block *vb,
                  vorbis_look_floor1 *look,
                  int *post,int *ilogmask){

  long i,j;
  vorbis_info_floor1 *info=look->vi;
  long posts=look->posts;
  codec_setup_info *ci=vb->vd->vi->codec_setup;
  int out[VIF_POSIT+2];
  static_codebook **sbooks=ci->book_param;
  codebook *books=ci->fullbooks;

  /* quantize values to multiplier spec */
  if(post){
    for(i=0;i<posts;i++){
      int val=post[i]&0x7fff;
      switch(info->mult){
      case 1: /* 1024 -> 256 */
        val>>=2;
        break;
      case 2: /* 1024 -> 128 */
        val>>=3;
        break;
      case 3: /* 1024 -> 86 */
        val/=12;
        break;
      case 4: /* 1024 -> 64 */
        val>>=4;
        break;
      }
      post[i]=val | (post[i]&0x8000);
    }

    out[0]=post[0];
    out[1]=post[1];

    /* find prediction values for each post and subtract them */
    for(i=2;i<posts;i++){
      int ln=look->loneighbor[i-2];
      int hn=look->hineighbor[i-2];
      int x0=info->postlist[ln];
      int x1=info->postlist[hn];
      int y0=post[ln];
      int y1=post[hn];

      int predicted=render_point(x0,x1,y0,y1,info->postlist[i]);

      if((post[i]&0x8000) || (predicted==post[i])){
        post[i]=predicted|0x8000; /* in case there was roundoff jitter
                                     in interpolation */
        out[i]=0;
      }else{
        int headroom=(look->quant_q-predicted<predicted?
                      look->quant_q-predicted:predicted);

        int val=post[i]-predicted;

        /* at this point the 'deviation' value is in the range +/- max
           range, but the real, unique range can always be mapped to
           only [0-maxrange).  So we want to wrap the deviation into
           this limited range, but do it in the way that least screws
           an essentially gaussian probability distribution. */

        if(val<0)
          if(val<-headroom)
            val=headroom-val-1;
          else
            val=-1-(val<<1);
        else
          if(val>=headroom)
            val= val+headroom;
          else
            val<<=1;

        out[i]=val;
        post[ln]&=0x7fff;
        post[hn]&=0x7fff;
      }
    }

    /* we have everything we need. pack it out */
    /* mark nontrivial floor */
    oggpack_write(opb,1,1);

    /* beginning/end post */
    look->frames++;
    look->postbits+=ov_ilog(look->quant_q-1)*2;
    oggpack_write(opb,out[0],ov_ilog(look->quant_q-1));
    oggpack_write(opb,out[1],ov_ilog(look->quant_q-1));


    /* partition by partition */
    for(i=0,j=2;i<info->partitions;i++){
      int class=info->partitionclass[i];
      int cdim=info->class_dim[class];
      int csubbits=info->class_subs[class];
      int csub=1<<csubbits;
      int bookas[8]={0,0,0,0,0,0,0,0};
      int cval=0;
      int cshift=0;
      int k,l;

      /* generate the partition's first stage cascade value */
      if(csubbits){
        int maxval[8]={0,0,0,0,0,0,0,0}; /* gcc's static analysis
                                            issues a warning without
                                            initialization */
        for(k=0;k<csub;k++){
          int booknum=info->class_subbook[class][k];
          if(booknum<0){
            maxval[k]=1;
          }else{
            maxval[k]=sbooks[info->class_subbook[class][k]]->entries;
          }
        }
        for(k=0;k<cdim;k++){
          for(l=0;l<csub;l++){
            int val=out[j+k];
            if(val<maxval[l]){
              bookas[k]=l;
              break;
            }
          }
          cval|= bookas[k]<<cshift;
          cshift+=csubbits;
        }
        /* write it */
        look->phrasebits+=
          vorbis_book_encode(books+info->class_book[class],cval,opb);

#ifdef TRAIN_FLOOR1
        {
          FILE *of;
          char buffer[80];
          sprintf(buffer,"line_%dx%ld_class%d.vqd",
                  vb->pcmend/2,posts-2,class);
          of=fopen(buffer,"a");
          fprintf(of,"%d\n",cval);
          fclose(of);
        }
#endif
      }

      /* write post values */
      for(k=0;k<cdim;k++){
        int book=info->class_subbook[class][bookas[k]];
        if(book>=0){
          /* hack to allow training with 'bad' books */
          if(out[j+k]<(books+book)->entries)
            look->postbits+=vorbis_book_encode(books+book,
                                               out[j+k],opb);
          /*else
            fprintf(stderr,"+!");*/

#ifdef TRAIN_FLOOR1
          {
            FILE *of;
            char buffer[80];
            sprintf(buffer,"line_%dx%ld_%dsub%d.vqd",
                    vb->pcmend/2,posts-2,class,bookas[k]);
            of=fopen(buffer,"a");
            fprintf(of,"%d\n",out[j+k]);
            fclose(of);
          }
#endif
        }
      }
      j+=cdim;
    }

    {
      /* generate quantized floor equivalent to what we'd unpack in decode */
      /* render the lines */
      int hx=0;
      int lx=0;
      int ly=post[0]*info->mult;
      int n=ci->blocksizes[vb->W]/2;

      for(j=1;j<look->posts;j++){
        int current=look->forward_index[j];
        int hy=post[current]&0x7fff;
        if(hy==post[current]){

          hy*=info->mult;
          hx=info->postlist[current];

          render_line0(n,lx,hx,ly,hy,ilogmask);

          lx=hx;
          ly=hy;
        }
      }
      for(j=hx;j<vb->pcmend/2;j++)ilogmask[j]=ly; /* be certain */
      return(1);
    }
  }else{
    oggpack_write(opb,0,1);
    memset(ilogmask,0,vb->pcmend/2*sizeof(*ilogmask));
    return(0);
  }
}